

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

void __thiscall Shader::Shader(Shader *this,GLchar *vertexPath,GLchar *fragmentPath)

{
  char cVar1;
  GLuint GVar2;
  GLuint GVar3;
  istream *piVar4;
  char *pcVar5;
  ostream *poVar6;
  GLchar local_6e8 [8];
  GLchar infoLog [512];
  istream local_4e0 [8];
  ifstream VertexShaderStream;
  undefined1 local_2d8 [8];
  ifstream FragmentShaderStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  size_type *local_b0;
  string VertexShaderCode;
  GLchar *FragmentSourcePointer;
  undefined1 local_70 [8];
  string FragmentShaderCode;
  GLchar *VertexSourcePointer;
  int local_38;
  GLuint local_34;
  GLint success;
  
  local_b0 = &VertexShaderCode._M_string_length;
  VertexShaderCode._M_dataplus._M_p = (pointer)0x0;
  VertexShaderCode._M_string_length._0_1_ = 0;
  std::ifstream::ifstream(local_4e0,vertexPath,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__cxx11::string::string((string *)local_2d8,"",(allocator *)local_70);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_4e0,(string *)local_2d8);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "\n",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2d8);
      std::__cxx11::string::append((string *)&local_b0);
      std::__cxx11::string::~string((string *)local_70);
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)local_2d8);
  }
  FragmentShaderCode.field_2._8_8_ = local_b0;
  local_34 = (*__glewCreateShader)(0x8b31);
  (*__glewShaderSource)(local_34,1,(GLchar **)((long)&FragmentShaderCode.field_2 + 8),(GLint *)0x0);
  (*__glewCompileShader)(local_34);
  (*__glewGetShaderiv)(local_34,0x8b81,&local_38);
  if (local_38 == 0) {
    pcVar5 = local_6e8;
    (*__glewGetShaderInfoLog)(local_34,0x200,(GLsizei *)0x0,pcVar5);
    poVar6 = std::operator<<((ostream *)&std::cout,"ERROR::SHADER::VERTEX::COMPILATION_FAILED\n");
  }
  else {
    pcVar5 = "loaded: \'vertexShader\'";
    poVar6 = (ostream *)&std::cout;
  }
  poVar6 = std::operator<<(poVar6,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar6);
  local_70 = (undefined1  [8])&FragmentShaderCode._M_string_length;
  FragmentShaderCode._M_dataplus._M_p = (pointer)0x0;
  FragmentShaderCode._M_string_length._0_1_ = 0;
  std::ifstream::ifstream(local_2d8,fragmentPath,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__cxx11::string::string
              ((string *)(VertexShaderCode.field_2._M_local_buf + 8),"",(allocator *)&local_d0);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_2d8,(string *)(VertexShaderCode.field_2._M_local_buf + 8)
                         );
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::operator+(&local_d0,"\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (VertexShaderCode.field_2._M_local_buf + 8));
      std::__cxx11::string::append((string *)local_70);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)(VertexShaderCode.field_2._M_local_buf + 8));
  }
  VertexShaderCode.field_2._8_8_ = local_70;
  GVar2 = (*__glewCreateShader)(0x8b30);
  (*__glewShaderSource)(GVar2,1,(GLchar **)((long)&VertexShaderCode.field_2 + 8),(GLint *)0x0);
  (*__glewCompileShader)(GVar2);
  (*__glewGetShaderiv)(GVar2,0x8b81,&local_38);
  if (local_38 == 0) {
    pcVar5 = local_6e8;
    (*__glewGetShaderInfoLog)(GVar2,0x200,(GLsizei *)0x0,pcVar5);
    poVar6 = std::operator<<((ostream *)&std::cout,"ERROR::SHADER::FRAGMENT::COMPILATION_FAILED\n");
  }
  else {
    pcVar5 = "loaded: \'fragmentShader\'";
    poVar6 = (ostream *)&std::cout;
  }
  poVar6 = std::operator<<(poVar6,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar6);
  GVar3 = (*__glewCreateProgram)();
  this->Program = GVar3;
  (*__glewAttachShader)(GVar3,local_34);
  (*__glewAttachShader)(this->Program,GVar2);
  (*__glewLinkProgram)(this->Program);
  (*__glewGetProgramiv)(this->Program,0x8b82,&local_38);
  if (local_38 == 0) {
    (*__glewGetProgramInfoLog)(this->Program,0x200,(GLsizei *)0x0,local_6e8);
    poVar6 = std::operator<<((ostream *)&std::cout,"ERROR::SHADER::PROGRAM::COMPILATION_FAILED [");
    poVar6 = std::operator<<(poVar6,local_6e8);
    pcVar5 = "]";
  }
  else {
    pcVar5 = "loaded: \'shaderProgram\'";
    poVar6 = (ostream *)&std::cout;
  }
  poVar6 = std::operator<<(poVar6,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar6);
  (*__glewDeleteShader)(local_34);
  (*__glewDeleteShader)(GVar2);
  std::ifstream::~ifstream(local_2d8);
  std::__cxx11::string::~string((string *)local_70);
  std::ifstream::~ifstream(local_4e0);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

Shader::Shader(const GLchar* vertexPath, const GLchar* fragmentPath) {
	// error info
	GLint success;
	GLchar infoLog[512];

	// get vertex shader code
	std::string VertexShaderCode;
	std::ifstream VertexShaderStream(vertexPath, std::ios::in);
	if (VertexShaderStream.is_open()) {
		std::string Line = "";
		while (getline(VertexShaderStream, Line)) {
			VertexShaderCode += "\n" + Line;
		}
		VertexShaderStream.close();
	}
	const GLchar* VertexSourcePointer = VertexShaderCode.c_str();

	// set vertexshader
	GLuint vertexShader;
	vertexShader = glCreateShader(GL_VERTEX_SHADER);

	glShaderSource(vertexShader, 1, &VertexSourcePointer, NULL);
	glCompileShader(vertexShader);

	glGetShaderiv(vertexShader, GL_COMPILE_STATUS, &success);

	if (!success) {
		glGetShaderInfoLog(vertexShader, 512, NULL, infoLog);
		std::cout << "ERROR::SHADER::VERTEX::COMPILATION_FAILED\n" << infoLog << std::endl;
	}
	else {
		std::cout << "loaded: 'vertexShader'" << std::endl;
	}

	// get fragment shader code
	std::string FragmentShaderCode;
	std::ifstream FragmentShaderStream(fragmentPath, std::ios::in);
	if (FragmentShaderStream.is_open()) {
		std::string Line = "";
		while (getline(FragmentShaderStream, Line)) {
			FragmentShaderCode += "\n" + Line;
		}
		FragmentShaderStream.close();
	}
	const GLchar* FragmentSourcePointer = FragmentShaderCode.c_str();

	// set fragmentshader
	GLuint fragmentShader;
	fragmentShader = glCreateShader(GL_FRAGMENT_SHADER);

	glShaderSource(fragmentShader, 1, &FragmentSourcePointer, NULL);
	glCompileShader(fragmentShader);

	glGetShaderiv(fragmentShader, GL_COMPILE_STATUS, &success);
	if (!success) {
		glGetShaderInfoLog(fragmentShader, 512, NULL, infoLog);
		std::cout << "ERROR::SHADER::FRAGMENT::COMPILATION_FAILED\n" << infoLog << std::endl;
	}
	else {
		std::cout << "loaded: 'fragmentShader'" << std::endl;
	}

	// set shader program
	this->Program = glCreateProgram();

	glAttachShader(this->Program, vertexShader);
	glAttachShader(this->Program, fragmentShader);
	glLinkProgram(this->Program);

	// load program
	glGetProgramiv(this->Program, GL_LINK_STATUS, &success);
	if (!success) {
		glGetProgramInfoLog(this->Program, 512, NULL, infoLog);
		std::cout << "ERROR::SHADER::PROGRAM::COMPILATION_FAILED [" << infoLog << "]" << std::endl;
	}
	else {
		std::cout << "loaded: 'shaderProgram'" << std::endl;
	}

	// delete shaders
	glDeleteShader(vertexShader);
	glDeleteShader(fragmentShader);
}